

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O2

REF_STATUS ref_node_metric_set_log(REF_NODE ref_node,REF_INT node,REF_DBL *log_m)

{
  REF_DBL *pRVar1;
  uint uVar2;
  long lVar3;
  REF_DBL m [6];
  REF_DBL local_48 [6];
  
  pRVar1 = ref_node->real;
  for (lVar3 = 0; lVar3 != 6; lVar3 = lVar3 + 1) {
    pRVar1[node * 0xf + 9 + (int)lVar3] = log_m[lVar3];
  }
  uVar2 = ref_matrix_exp_m(log_m,local_48);
  if (uVar2 == 0) {
    pRVar1 = ref_node->real;
    uVar2 = 0;
    for (lVar3 = 0; lVar3 != 6; lVar3 = lVar3 + 1) {
      pRVar1[node * 0xf + 3 + (int)lVar3] = local_48[lVar3];
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x537,
           "ref_node_metric_set_log",(ulong)uVar2,"exp");
  }
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_node_metric_set_log(REF_NODE ref_node, REF_INT node,
                                           REF_DBL *log_m) {
  REF_INT i;
  REF_DBL m[6];
  for (i = 0; i < 6; i++) {
    ((ref_node)->real[(i + 9) + REF_NODE_REAL_PER * (node)]) = log_m[i];
  }
  RSS(ref_matrix_exp_m(log_m, m), "exp");
  for (i = 0; i < 6; i++) {
    ((ref_node)->real[(i + 3) + REF_NODE_REAL_PER * (node)]) = m[i];
  }
  return REF_SUCCESS;
}